

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONValue.cpp
# Opt level: O1

void __thiscall JSONValue::~JSONValue(JSONValue *this)

{
  JSONType JVar1;
  JSONValue *pJVar2;
  _Rb_tree_node_base *p_Var3;
  pointer ppJVar4;
  wstring *this_00;
  _Self __tmp;
  
  JVar1 = this->type;
  if (JVar1 == JSONType_String) {
    this_00 = (wstring *)(this->field_1).array_value;
    if (this_00 == (wstring *)0x0) {
      return;
    }
    ppJVar4 = (((_Vector_base<JSONValue_*,_std::allocator<JSONValue_*>_> *)&this_00->_M_dataplus)->
              _M_impl).super__Vector_impl_data._M_start;
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)ppJVar4 == &this_00->field_2) goto LAB_001732ac;
  }
  else {
    if (JVar1 == JSONType_Object) {
      this_00 = (this->field_1).string_value;
      p_Var3 = *(_Rb_tree_node_base **)((long)&this_00->field_2 + 8);
      while (p_Var3 != (_Rb_tree_node_base *)&this_00->_M_string_length) {
        pJVar2 = *(JSONValue **)(p_Var3 + 2);
        if (pJVar2 != (JSONValue *)0x0) {
          ~JSONValue(pJVar2);
          operator_delete(pJVar2);
        }
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
        this_00 = (this->field_1).string_value;
      }
      if (this_00 == (wstring *)0x0) {
        return;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                   *)this_00);
      goto LAB_001732ac;
    }
    if (JVar1 != JSONType_Array) {
      return;
    }
    this_00 = (wstring *)(this->field_1).array_value;
    for (ppJVar4 = (((_Vector_base<JSONValue_*,_std::allocator<JSONValue_*>_> *)
                    &this_00->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start;
        ppJVar4 != (pointer)this_00->_M_string_length; ppJVar4 = ppJVar4 + 1) {
      pJVar2 = *ppJVar4;
      if (pJVar2 != (JSONValue *)0x0) {
        ~JSONValue(pJVar2);
        operator_delete(pJVar2);
      }
      this_00 = (wstring *)(this->field_1).array_value;
    }
    if (this_00 == (wstring *)0x0) {
      return;
    }
    ppJVar4 = (((_Vector_base<JSONValue_*,_std::allocator<JSONValue_*>_> *)&this_00->_M_dataplus)->
              _M_impl).super__Vector_impl_data._M_start;
    if (ppJVar4 == (pointer)0x0) goto LAB_001732ac;
  }
  operator_delete(ppJVar4);
LAB_001732ac:
  operator_delete(this_00);
  return;
}

Assistant:

JSONValue::~JSONValue()
{
	if (type == JSONType_Array)
	{
		JSONArray::iterator iter;
		for (iter = array_value->begin(); iter != array_value->end(); iter++)
			delete *iter;
		delete array_value;
	}
	else if (type == JSONType_Object)
	{
		JSONObject::iterator iter;
		for (iter = object_value->begin(); iter != object_value->end(); iter++)
		{
			delete (*iter).second;
		}
		delete object_value;
	}
	else if (type == JSONType_String)
	{
		delete string_value;
	}
}